

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_dolabelpos(t_object *obj,t_iemgui *iemgui)

{
  int iVar1;
  int iVar2;
  int iVar3;
  t_symbol *ptVar4;
  _glist *p_Var5;
  char local_b8 [8];
  char tag [128];
  int local_2c;
  int local_28;
  int dy;
  int dx;
  int y0;
  int x0;
  int zoom;
  t_iemgui *iemgui_local;
  t_object *obj_local;
  
  iVar1 = glist_getzoom(iemgui->x_glist);
  iVar2 = text_xpix(obj,iemgui->x_glist);
  iVar3 = text_ypix(obj,iemgui->x_glist);
  local_28 = iemgui->x_ldx;
  local_2c = iemgui->x_ldy;
  sprintf(local_b8,"%lxLABEL",obj);
  ptVar4 = gensym("");
  if (ptVar4 == iemgui->x_lab) {
    local_28 = 0;
    local_2c = 7;
  }
  p_Var5 = glist_getcanvas(iemgui->x_glist);
  pdgui_vmess((char *)0x0,"crs ii",p_Var5,"coords",local_b8,(ulong)(uint)(iVar2 + local_28 * iVar1),
              iVar3 + local_2c * iVar1);
  return;
}

Assistant:

static void iemgui_dolabelpos(t_object*obj, t_iemgui*iemgui) {
    int zoom = glist_getzoom(iemgui->x_glist);
    int x0 = text_xpix((t_object *)obj, iemgui->x_glist);
    int y0 = text_ypix((t_object *)obj, iemgui->x_glist);
    int dx = iemgui->x_ldx, dy = iemgui->x_ldy;
    char tag[128];
    sprintf(tag, "%lxLABEL", obj);
    if(gensym("") == iemgui->x_lab) {
        /* put empty labels where they don't create scrollbars */
        dx = 0;
        dy = 7;
    }
    pdgui_vmess(0, "crs ii",
        glist_getcanvas(iemgui->x_glist), "coords", tag,
        x0  + dx*zoom, y0 + dy*zoom);
}